

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::IMLE(IMLE *this,int d,int D,Param *prm,int pre_alloc)

{
  this->d = d;
  this->D = D;
  Param::Param(&this->param,d,D);
  (this->experts).
  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->experts).
  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->experts).
  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  memset(&this->zQuery,0,0x88);
  memset(&this->zeta,0,0xc0);
  memset(&this->sNearestInv,0,200);
  memset(&this->zeroZZ,0,0x90);
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)pre_alloc);
  reset(this,prm);
  return;
}

Assistant:

IMLE_base::IMLE(Param const &prm, int pre_alloc)
#endif
{
    init( pre_alloc );
    reset(prm);
}